

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O1

void Aig_ManPartDivide(Vec_Ptr_t *vResult,Vec_Int_t *vDomain,int nPartSize,int nOverSize)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  void **ppvVar4;
  int iVar5;
  uint uVar6;
  
  if ((nPartSize == 0) || (vDomain->nSize <= nPartSize)) {
    __assert_fail("nPartSize && Vec_IntSize(vDomain) > nPartSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                  ,0x205,"void Aig_ManPartDivide(Vec_Ptr_t *, Vec_Int_t *, int, int)");
  }
  if (nPartSize <= nOverSize) {
    printf("Overlap size (%d) is more or equal than the partition size (%d).\n",
           (ulong)(uint)nOverSize,(ulong)(uint)nPartSize);
    puts("Adjusting it to be equal to half of the partition size.");
    nOverSize = nPartSize / 2;
  }
  if (nPartSize <= nOverSize) {
    __assert_fail("nOverSize < nPartSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPartReg.c"
                  ,0x20c,"void Aig_ManPartDivide(Vec_Ptr_t *, Vec_Int_t *, int, int)");
  }
  if (0 < vDomain->nSize) {
    iVar2 = 0x10;
    if (0x10 < (uint)nPartSize) {
      iVar2 = nPartSize;
    }
    uVar6 = 0;
    do {
      p = (Vec_Int_t *)malloc(0x10);
      p->nSize = 0;
      p->nCap = iVar2;
      piVar3 = (int *)malloc((long)iVar2 << 2);
      p->pArray = piVar3;
      iVar5 = nPartSize;
      if (0 < nPartSize) {
        do {
          if ((int)uVar6 < vDomain->nSize) {
            if ((int)uVar6 < 0) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            Vec_IntPush(p,vDomain->pArray[uVar6]);
          }
          uVar6 = uVar6 + 1;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      if (nOverSize < p->nSize) {
        uVar1 = vResult->nCap;
        if (vResult->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (vResult->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vResult->pArray,0x80);
            }
            vResult->pArray = ppvVar4;
            iVar5 = 0x10;
          }
          else {
            iVar5 = uVar1 * 2;
            if (iVar5 <= (int)uVar1) goto LAB_00637c8f;
            if (vResult->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vResult->pArray,(ulong)uVar1 << 4);
            }
            vResult->pArray = ppvVar4;
          }
          vResult->nCap = iVar5;
        }
LAB_00637c8f:
        iVar5 = vResult->nSize;
        vResult->nSize = iVar5 + 1;
        vResult->pArray[iVar5] = p;
      }
      else {
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        free(p);
      }
      uVar6 = uVar6 - nOverSize;
    } while ((int)uVar6 < vDomain->nSize);
  }
  return;
}

Assistant:

void Aig_ManPartDivide( Vec_Ptr_t * vResult, Vec_Int_t * vDomain, int nPartSize, int nOverSize )
{
    Vec_Int_t * vPart;
    int i, Counter;
    assert( nPartSize && Vec_IntSize(vDomain) > nPartSize );
    if ( nOverSize >= nPartSize )
    {
        printf( "Overlap size (%d) is more or equal than the partition size (%d).\n", nOverSize, nPartSize );
        printf( "Adjusting it to be equal to half of the partition size.\n" );
        nOverSize = nPartSize/2;
    }
    assert( nOverSize < nPartSize );
    for ( Counter = 0; Counter < Vec_IntSize(vDomain); Counter -= nOverSize )
    {
        vPart = Vec_IntAlloc( nPartSize );
        for ( i = 0; i < nPartSize; i++, Counter++ )
            if ( Counter < Vec_IntSize(vDomain) )
                Vec_IntPush( vPart, Vec_IntEntry(vDomain, Counter) );
        if ( Vec_IntSize(vPart) <= nOverSize )
            Vec_IntFree(vPart);
        else
            Vec_PtrPush( vResult, vPart );
    }
}